

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelproblem_circle_main.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  pointer pcVar1;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this;
  SparseMatrix<double,_0,_int> *dst;
  SparseMatrix<double,_0,_int> *dst_00;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_00;
  pointer pcVar2;
  RefEl RVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  element_type *peVar6;
  RhsNested pSVar7;
  undefined1 auVar8 [16];
  UniformScalarFESpace<double> *pUVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined8 uVar10;
  Scalar *pSVar11;
  StorageIndex *pSVar12;
  Index IVar13;
  Index IVar14;
  _func_int **pp_Var15;
  StorageIndex *pSVar16;
  StorageIndex *pSVar17;
  Index IVar18;
  Index IVar19;
  int iVar20;
  uint uVar21;
  ComputationInfo CVar22;
  tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_> tVar23;
  undefined4 extraout_var;
  ostream *poVar25;
  Scalar *pSVar26;
  DofHandler *pDVar27;
  ScalarReferenceFiniteElement<double> *pSVar28;
  Scalar *pSVar29;
  Entity *e;
  double *pdVar30;
  runtime_error *prVar31;
  undefined8 *puVar32;
  Index index;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  size_t sVar36;
  element_type *peVar37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var38;
  QuadRule *pQVar39;
  ActualDstType actualDst;
  long lVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var41;
  element_type *peVar42;
  dim_t codim;
  COOMatrix<double> *in_R8;
  double __tmp;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  VectorXd cap;
  VectorXd u0;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space;
  shared_ptr<const_lf::mesh::Mesh> mesh_p;
  shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>_> nodal_data;
  SparseMatrix<double,_0,_int> A_sps;
  MatrixXd L;
  COOMatrix<double> A_COO;
  COOMatrix<double> M_COO;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  MatrixXd sol;
  MatrixXd A_ds;
  string mesh_file;
  SparseMatrix<double,_0,_int> A;
  stringstream ss;
  path here;
  MatrixXd A_ds1;
  CodimMeshDataSet<bool> bd_flags;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_modelproblem_circle_main_cc:53:12)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>_>
  elMat_Stiff;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:139:14)>_>
  elMat_Mass;
  GmshReader reader;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1028;
  ulong local_1018;
  uint local_100c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1008;
  undefined8 uStack_1000;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_ff8;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_fe8;
  UniformScalarFESpace<double> *local_fe0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd8;
  element_type *local_fd0;
  long *local_fc8;
  shared_ptr<const_lf::mesh::Mesh> local_fc0;
  uint local_fac;
  pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>_> local_fa8;
  undefined1 local_f18 [32];
  double *local_ef8;
  CompressedStorage<double,_int> local_ef0;
  undefined1 local_ed0 [32];
  RhsNested pSStack_eb0;
  CompressedStorage<double,_int> local_ea8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e88;
  undefined1 local_e68 [24];
  anon_class_8_1_fdfac9c8_for_edge_sel_ local_e50;
  shared_ptr<const_lf::mesh::Mesh> local_e48;
  undefined1 local_e38 [24];
  pointer local_e20;
  shared_ptr<const_lf::mesh::Mesh> local_e18;
  undefined1 local_e08 [32];
  PrecomputedScalarReferenceFiniteElement<double> local_de8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d78;
  string local_d58;
  DofHandler *local_d38;
  undefined1 local_d30 [32];
  StorageIndex *pSStack_d10;
  CompressedStorage<double,_int> local_d08;
  string local_ce8;
  undefined1 local_cc8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_cb8;
  RhsNested pSStack_ca8;
  CompressedStorage<double,_int> local_ca0;
  double *local_c68;
  Scalar *local_c60;
  CompressedStorage<double,_int> local_c58 [8];
  path local_b40;
  IndexPointer local_b18 [3];
  CodimMeshDataSet<bool> local_b00;
  undefined1 local_ac8 [16];
  undefined1 auStack_ab8 [16];
  undefined1 auStack_aa8 [8];
  undefined1 local_aa0 [16];
  QuadRule local_a90 [11];
  undefined1 local_870 [16];
  undefined1 local_860 [24];
  undefined1 local_848 [560];
  StrangSplit local_618;
  GmshReader local_b8;
  long *plVar24;
  undefined4 extraout_var_00;
  
  tVar23.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       operator_new(0x60);
  *(undefined ***)
   tVar23.
   super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
   super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = &PTR_DimWorld_0048f290;
  *(undefined4 *)
   ((long)tVar23.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 2;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48) = 0;
  *(long *)((long)tVar23.
                  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                  .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined1 *)
   ((long)tVar23.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
  std::filesystem::__cxx11::path::path<char[119],std::filesystem::__cxx11::path>
            (&local_b40,
             (char (*) [119])
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/fisher_kpp/modelproblem_circle_main.cc"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[19],std::filesystem::__cxx11::path>
            ((path *)local_870,(char (*) [19])"/meshes/circle.msh",auto_format);
  std::filesystem::__cxx11::operator/((path *)&local_618,(path *)local_ac8,(path *)local_870);
  local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d58,local_618._vptr_StrangSplit,
             (long)&((local_618.fe_space_.
                      super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ScalarFESpace<double>)._vptr_ScalarFESpace +
             (long)local_618._vptr_StrangSplit);
  std::filesystem::__cxx11::path::~path((path *)&local_618);
  std::filesystem::__cxx11::path::~path((path *)local_870);
  std::filesystem::__cxx11::path::~path((path *)local_ac8);
  local_fe8._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       tVar23.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
  lf::io::GmshReader::GmshReader
            (&local_b8,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
             &local_fe8,&local_d58);
  if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
      local_fe8._M_t.
      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0) {
    (**(code **)(*(long *)local_fe8._M_t.
                          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38
                ))();
  }
  local_fe8._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
       (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)0x0;
  local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_618._vptr_StrangSplit = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lf::uscalfe::FeSpaceLagrangeO1<double>,std::allocator<lf::uscalfe::FeSpaceLagrangeO1<double>>,std::shared_ptr<lf::mesh::Mesh_const>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_618.fe_space_,
             (FeSpaceLagrangeO1<double> **)&local_618,
             (allocator<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)local_ac8,&local_fc0);
  pp_Var15 = local_618._vptr_StrangSplit;
  local_fd0 = local_618.fe_space_.
              super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  iVar20 = (*((ScalarFESpace<double> *)local_618._vptr_StrangSplit)->_vptr_ScalarFESpace[1])
                     (local_618._vptr_StrangSplit);
  plVar24 = (long *)CONCAT44(extraout_var,iVar20);
  local_100c = (**(code **)(*plVar24 + 0x10))(plVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N_dofs :",8);
  local_1018 = (ulong)local_100c;
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_618._vptr_StrangSplit = (_func_int **)CONCAT71(local_618._vptr_StrangSplit._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,(char *)&local_618,1);
  local_ff8.m_storage.m_data = (double *)0x0;
  local_ff8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_ff8,local_1018);
  local_ac8._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_618,local_ff8.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)local_ac8);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_ff8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_618,(assign_op<double,_double> *)local_ac8);
  auVar8 = _DAT_003be020;
  auVar4 = _DAT_003be010;
  if (0 < local_ff8.m_storage.m_rows) {
    uVar33 = local_ff8.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar45._8_4_ = (int)uVar33;
    auVar45._0_8_ = uVar33;
    auVar45._12_4_ = (int)(uVar33 >> 0x20);
    lVar34 = 0;
    auVar45 = auVar45 ^ _DAT_003be020;
    do {
      auVar49._8_4_ = (int)lVar34;
      auVar49._0_8_ = lVar34;
      auVar49._12_4_ = (int)((ulong)lVar34 >> 0x20);
      auVar49 = (auVar49 | auVar4) ^ auVar8;
      if ((bool)(~(auVar49._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar49._0_4_ ||
                  auVar45._4_4_ < auVar49._4_4_) & 1)) {
        local_ff8.m_storage.m_data[lVar34] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      if ((auVar49._12_4_ != auVar45._12_4_ || auVar49._8_4_ <= auVar45._8_4_) &&
          auVar49._12_4_ <= auVar45._12_4_) {
        local_ff8.m_storage.m_data[lVar34 + 1] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      lVar34 = lVar34 + 2;
    } while ((uVar33 - ((uint)(local_ff8.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar34
            );
  }
  pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_ff8,0);
  *pSVar26 = 0.001;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"norm u0 ",8);
  local_618._vptr_StrangSplit = (_func_int **)&local_ff8;
  if (local_ff8.m_storage.m_rows == 0) {
    dVar43 = 0.0;
  }
  else {
    dVar43 = Eigen::
             DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
             ::redux<Eigen::internal::scalar_sum_op<double,double>>
                       ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)&local_618,(scalar_sum_op<double,_double> *)local_ac8);
  }
  poVar25 = std::ostream::_M_insert<double>(SQRT(dVar43));
  local_618._vptr_StrangSplit = (_func_int **)CONCAT71(local_618._vptr_StrangSplit._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,(char *)&local_618,1);
  local_e88.m_storage.m_data = (double *)0x0;
  local_e88.m_storage.m_rows = 0;
  local_e88.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_e88,local_1018,local_1018);
  local_ac8._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&local_618,local_e88.m_storage.m_rows,local_e88.m_storage.m_cols,
                   (scalar_constant_op<double> *)local_ac8);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_e88,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_618,(assign_op<double,_double> *)local_ac8);
  auVar8 = _DAT_003be020;
  auVar4 = _DAT_003be010;
  if (0 < local_e88.m_storage.m_rows * local_e88.m_storage.m_cols) {
    uVar33 = local_e88.m_storage.m_rows * local_e88.m_storage.m_cols + 0x1fffffffffffffff;
    uVar35 = uVar33 & 0x1fffffffffffffff;
    auVar46._8_4_ = (int)uVar35;
    auVar46._0_8_ = uVar35;
    auVar46._12_4_ = (int)(uVar35 >> 0x20);
    lVar34 = 0;
    auVar46 = auVar46 ^ _DAT_003be020;
    do {
      auVar50._8_4_ = (int)lVar34;
      auVar50._0_8_ = lVar34;
      auVar50._12_4_ = (int)((ulong)lVar34 >> 0x20);
      auVar45 = (auVar50 | auVar4) ^ auVar8;
      if ((bool)(~(auVar45._4_4_ == auVar46._4_4_ && auVar46._0_4_ < auVar45._0_4_ ||
                  auVar46._4_4_ < auVar45._4_4_) & 1)) {
        local_e88.m_storage.m_data[lVar34] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      if ((auVar45._12_4_ != auVar46._12_4_ || auVar45._8_4_ <= auVar46._8_4_) &&
          auVar45._12_4_ <= auVar46._12_4_) {
        local_e88.m_storage.m_data[lVar34 + 1] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      lVar34 = lVar34 + 2;
    } while ((uVar35 - ((uint)uVar33 & 1)) + 2 != lVar34);
  }
  local_1028.m_storage.m_data = (double *)0x0;
  local_1028.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1028,local_1018);
  local_ac8._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_618,local_1028.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)local_ac8);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1028,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_618,(assign_op<double,_double> *)local_ac8);
  auVar8 = _DAT_003be020;
  auVar4 = _DAT_003be010;
  if (0 < local_1028.m_storage.m_rows) {
    uVar33 = local_1028.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar47._8_4_ = (int)uVar33;
    auVar47._0_8_ = uVar33;
    auVar47._12_4_ = (int)(uVar33 >> 0x20);
    lVar34 = 0;
    auVar47 = auVar47 ^ _DAT_003be020;
    do {
      auVar51._8_4_ = (int)lVar34;
      auVar51._0_8_ = lVar34;
      auVar51._12_4_ = (int)((ulong)lVar34 >> 0x20);
      auVar45 = (auVar51 | auVar4) ^ auVar8;
      if ((bool)(~(auVar45._4_4_ == auVar47._4_4_ && auVar47._0_4_ < auVar45._0_4_ ||
                  auVar47._4_4_ < auVar45._4_4_) & 1)) {
        local_1028.m_storage.m_data[lVar34] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      if ((auVar45._12_4_ != auVar47._12_4_ || auVar45._8_4_ <= auVar47._8_4_) &&
          auVar45._12_4_ <= auVar47._12_4_) {
        local_1028.m_storage.m_data[lVar34 + 1] =
             (double)local_618.fe_space_.
                     super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      }
      lVar34 = lVar34 + 2;
    } while ((uVar33 - ((uint)(local_1028.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 !=
             lVar34);
  }
  local_ac8._0_8_ = &DAT_3ff0000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_870,local_1018,1,(scalar_constant_op<double> *)local_ac8);
  local_cc8._0_8_ = (_func_int **)0x3fe999999999999a;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_ac8,local_870._0_8_,1,(scalar_constant_op<double> *)local_cc8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_618,(Lhs *)local_ac8,(Rhs *)local_870,
                  (scalar_product_op<double,_double> *)local_e08);
  local_1008 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.T_;
  uStack_1000 = 0;
  local_fc8 = (long *)local_618.lambda_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1028,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_618,(assign_op<double,_double> *)local_ac8);
  uVar33 = local_1028.m_storage.m_rows - (local_1028.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  dVar43 = (double)local_1008 * (double)local_fc8;
  if (1 < local_1028.m_storage.m_rows) {
    lVar34 = 0;
    do {
      local_1028.m_storage.m_data[lVar34] = dVar43;
      (local_1028.m_storage.m_data + lVar34)[1] = dVar43;
      lVar34 = lVar34 + 2;
    } while (lVar34 < (long)uVar33);
  }
  auVar8 = _DAT_003be020;
  auVar4 = _DAT_003be010;
  lVar34 = local_1028.m_storage.m_rows % 2;
  if (lVar34 != 0 && (long)uVar33 <= local_1028.m_storage.m_rows) {
    lVar40 = lVar34 + -1;
    auVar44._8_4_ = (int)lVar40;
    auVar44._0_8_ = lVar40;
    auVar44._12_4_ = (int)((ulong)lVar40 >> 0x20);
    uVar33 = 0;
    auVar44 = auVar44 ^ _DAT_003be020;
    do {
      auVar48._8_4_ = (int)uVar33;
      auVar48._0_8_ = uVar33;
      auVar48._12_4_ = (int)(uVar33 >> 0x20);
      auVar45 = (auVar48 | auVar4) ^ auVar8;
      if ((bool)(~(auVar45._4_4_ == auVar44._4_4_ && auVar44._0_4_ < auVar45._0_4_ ||
                  auVar44._4_4_ < auVar45._4_4_) & 1)) {
        local_1028.m_storage.m_data[(local_1028.m_storage.m_rows / 2) * 2 + uVar33] = dVar43;
      }
      if ((auVar45._12_4_ != auVar44._12_4_ || auVar45._8_4_ <= auVar44._8_4_) &&
          auVar45._12_4_ <= auVar44._12_4_) {
        local_1028.m_storage.m_data[(local_1028.m_storage.m_rows / 2) * 2 + uVar33 + 1] = dVar43;
      }
      uVar33 = uVar33 + 2;
    } while ((lVar34 + 1U & 0xfffffffffffffffe) != uVar33);
  }
  local_618._vptr_StrangSplit = (_func_int **)&PTR__StrangSplit_0048cfa8;
  local_618.fe_space_.
  super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var15;
  local_618.fe_space_.
  super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fd0;
  if (local_fd0 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_fd0->rfs_tria_p_).
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(local_fd0->rfs_tria_p_).
                    super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_fd0->rfs_tria_p_).
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr =
           *(int *)&(local_fd0->rfs_tria_p_).
                    super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  local_618.T_ = 1.0;
  local_618.m_ = 100;
  local_618.lambda_ = 0.008;
  local_618.A_.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_618.A_.m_outerSize = -1;
  local_618.A_.m_innerSize = 0;
  local_618.A_.m_outerIndex = (StorageIndex *)0x0;
  local_618.A_.m_innerNonZeros = (StorageIndex *)0x0;
  local_618.A_.m_data.m_values = (Scalar *)0x0;
  local_618.A_.m_data.m_indices = (StorageIndex *)0x0;
  local_618.A_.m_data.m_size = 0;
  local_618.A_.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_618.A_,0,0);
  local_618.M_.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_618.M_.m_outerSize = -1;
  local_618.M_.m_innerSize = 0;
  local_618.M_.m_outerIndex = (StorageIndex *)0x0;
  local_618.M_.m_innerNonZeros = (StorageIndex *)0x0;
  local_618.M_.m_data.m_values = (Scalar *)0x0;
  local_618.M_.m_data.m_indices = (StorageIndex *)0x0;
  local_618.M_.m_data.m_size = 0;
  local_618.M_.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_618.M_,0,0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            (&local_618.solver1);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            (&local_618.solver2);
  iVar20 = (*((local_618.fe_space_.
               super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
  pDVar27 = (DofHandler *)CONCAT44(extraout_var_00,iVar20);
  (*pDVar27->_vptr_DofHandler[2])(pDVar27);
  std::pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>_>::
  pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>,_true>(&local_fa8);
  (*pDVar27->_vptr_DofHandler[8])(&local_e18,pDVar27);
  uVar21 = (*pDVar27->_vptr_DofHandler[2])(pDVar27);
  local_fe0 = (UniformScalarFESpace<double> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lf::uscalfe::FeSpaceLagrangeO1<double>,std::allocator<lf::uscalfe::FeSpaceLagrangeO1<double>>,std::shared_ptr<lf::mesh::Mesh_const>&>
            (&local_fd8,(FeSpaceLagrangeO1<double> **)&local_fe0,
             (allocator<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)local_ac8,&local_e18);
  lf::mesh::utils::flagEntitiesOnBoundary(&local_b00,&local_e18,1);
  pUVar9 = local_fe0;
  local_e68._8_8_ = (pointer)0x0;
  local_e68._16_8_ = (pointer)0x0;
  local_e50.bd_flags = (CodimMeshDataSet<bool> *)0x0;
  local_e38._8_8_ = (pointer)0x0;
  local_e38._16_8_ = (pointer)0x0;
  local_e20 = (pointer)0x0;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
    }
  }
  local_1008 = local_fd8._M_pi;
  local_ac8._0_8_ = &PTR_isActive_0048d540;
  local_ac8._8_8_ = &PTR__MeshFunctionGlobal_0048d480;
  auStack_ab8._8_8_ = &PTR__MeshFunctionGlobal_0048d510;
  lVar34 = 0;
  local_fac = uVar21;
  local_e68._0_4_ = uVar21;
  local_e68._4_4_ = uVar21;
  local_e38._0_4_ = uVar21;
  local_e38._4_4_ = uVar21;
  memset(local_aa0,0,0x230);
  pQVar39 = local_a90;
  do {
    pQVar39[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)&PTR__PrecomputedScalarReferenceFiniteElement_0048d600;
    pQVar39[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    lf::quad::QuadRule::QuadRule(pQVar39);
    pQVar39[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    pQVar39[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 0;
    pQVar39[1].ref_el_ = 0;
    *(undefined3 *)&pQVar39[1].field_0x1 = 0;
    pQVar39[1].degree_ = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    lVar34 = lVar34 + -0x70;
    pQVar39 = (QuadRule *)
              &pQVar39[2].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
  } while (lVar34 != -0x230);
  local_e08._0_2_ = 0x403;
  lVar34 = 0;
  local_fc8 = plVar24;
  local_d38 = pDVar27;
  do {
    RVar3.type_ = local_e08[lVar34];
    pSVar28 = lf::uscalfe::UniformScalarFESpace<double>::ShapeFunctionLayout(pUVar9,RVar3);
    if (pSVar28 != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar20 = (*pSVar28->_vptr_ScalarReferenceFiniteElement[3])(pSVar28);
      lf::quad::make_QuadRule((QuadRule *)local_cc8,RVar3,iVar20 * 2);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_870,pSVar28,
                 (QuadRule *)local_cc8);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
                ((PrecomputedScalarReferenceFiniteElement<double> *)
                 (local_aa0 + (ulong)RVar3.type_ * 0x70),
                 (PrecomputedScalarReferenceFiniteElement<double> *)local_870);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_870);
      free(pSStack_ca8);
      free((void *)local_cc8._8_8_);
    }
    lVar34 = lVar34 + 1;
  } while (lVar34 != 2);
  if (local_1008 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1008);
  }
  pUVar9 = local_fe0;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
    }
  }
  local_1008 = local_fd8._M_pi;
  local_870._0_8_ = &PTR_isActive_0048d578;
  local_870._8_8_ = &PTR__MeshFunctionGlobal_0048d510;
  local_860._8_8_ = &PTR__MeshFunctionGlobal_0048d4e0;
  lVar34 = 0;
  memset(local_848,0,0x230);
  pQVar39 = (QuadRule *)(local_848 + 0x10);
  do {
    pQVar39[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)&PTR__PrecomputedScalarReferenceFiniteElement_0048d600;
    pQVar39[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    lf::quad::QuadRule::QuadRule(pQVar39);
    pQVar39[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    pQVar39[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 0;
    pQVar39[1].ref_el_ = 0;
    *(undefined3 *)&pQVar39[1].field_0x1 = 0;
    pQVar39[1].degree_ = 0;
    pQVar39[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    lVar34 = lVar34 + -0x70;
    pQVar39 = (QuadRule *)
              &pQVar39[2].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
  } while (lVar34 != -0x230);
  local_f18._0_2_ = 0x403;
  lVar34 = 0;
  do {
    RVar3.type_ = local_f18[lVar34];
    pSVar28 = lf::uscalfe::UniformScalarFESpace<double>::ShapeFunctionLayout(pUVar9,RVar3);
    if (pSVar28 != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar20 = (*pSVar28->_vptr_ScalarReferenceFiniteElement[3])(pSVar28);
      lf::quad::make_QuadRule((QuadRule *)local_e08,RVar3,iVar20 * 2);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_cc8,pSVar28,
                 (QuadRule *)local_e08);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
                ((PrecomputedScalarReferenceFiniteElement<double> *)
                 (local_848 + (ulong)RVar3.type_ * 0x70),
                 (PrecomputedScalarReferenceFiniteElement<double> *)local_cc8);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement
                ((PrecomputedScalarReferenceFiniteElement<double> *)local_cc8);
      free(local_de8.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement);
      free((void *)local_e08._8_8_);
    }
    lVar34 = lVar34 + 1;
  } while (lVar34 != 2);
  if (local_1008 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1008);
  }
  this_01._M_pi = local_fd8._M_pi;
  pUVar9 = local_fe0;
  this = &local_618.solver2;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_fd8._M_pi)->_M_use_count = (local_fd8._M_pi)->_M_use_count + 1;
    }
  }
  local_e08._0_8_ = &PTR__MassEdgeMatrixProvider_0048d5b0;
  local_e08._8_8_ = &PTR__MeshFunctionGlobal_0048d4b0;
  local_e08._24_8_ = &local_b00;
  local_de8.qr_.ref_el_.type_ = 0;
  local_de8.qr_._1_3_ = 0;
  local_de8.qr_.degree_ = 0;
  local_de8.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_de8.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  local_de8.qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  local_de8.qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  local_de8.qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  local_de8.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__PrecomputedScalarReferenceFiniteElement_0048d600;
  local_de8.fe_ = (ScalarReferenceFiniteElement<double> *)0x0;
  lf::quad::QuadRule::QuadRule(&local_de8.qr_);
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  local_de8.grad_shape_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_de8.shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  pSVar28 = (pUVar9->rfs_edge_p_).
            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (pSVar28 == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_cc8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_cc8 + 0x10),"No shape functions specified for edges",0x26);
    pcVar1 = local_f18 + 0x10;
    local_f18._16_4_ = 0x21206566;
    local_f18[0x14] = '=';
    local_f18[0x15] = ' ';
    local_f18._22_2_ = 0x756e;
    local_f18._24_5_ = 0x7274706c6c;
    local_f18._8_8_ = (double *)0xd;
    local_f18[0x1d] = '\0';
    pcVar2 = local_ed0 + 0x10;
    local_f18._0_8_ = pcVar1;
    local_ed0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ed0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_f18,(string *)local_ed0,0x193,(string *)local_d30);
    if ((undefined1 *)local_d30._0_8_ != local_d30 + 0x10) {
      operator_delete((void *)local_d30._0_8_,local_d30._16_8_ + 1);
    }
    if ((pointer)local_ed0._0_8_ != pcVar2) {
      operator_delete((void *)local_ed0._0_8_,local_ed0._16_8_ + 1);
    }
    if ((pointer)local_f18._0_8_ != pcVar1) {
      operator_delete((void *)local_f18._0_8_,
                      CONCAT26(local_f18._22_2_,
                               CONCAT15(local_f18[0x15],CONCAT14(local_f18[0x14],local_f18._16_4_)))
                      + 1);
    }
    local_f18._16_4_ = 0x736c6166;
    local_f18[0x14] = 'e';
    local_f18[0x15] = '\0';
    local_f18._8_8_ = (double *)0x5;
    local_f18._0_8_ = pcVar1;
    local_ed0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ed0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    local_d30._8_8_ = (ScalarReferenceFiniteElement<double> *)0x0;
    local_d30._16_8_ = local_d30._16_8_ & 0xffffffffffffff00;
    local_d30._0_8_ = local_d30 + 0x10;
    lf::base::AssertionFailed((string *)local_f18,(string *)local_ed0,0x193,(string *)local_d30);
    std::__cxx11::string::~string((string *)local_d30);
    std::__cxx11::string::~string((string *)local_ed0);
    std::__cxx11::string::~string((string *)local_f18);
    abort();
  }
  iVar20 = (*pSVar28->_vptr_ScalarReferenceFiniteElement[3])(pSVar28);
  lf::quad::make_QuadRule((QuadRule *)local_f18,(RefEl)0x2,iVar20 * 2);
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
  PrecomputedScalarReferenceFiniteElement
            ((PrecomputedScalarReferenceFiniteElement<double> *)local_cc8,pSVar28,
             (QuadRule *)local_f18);
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=
            (&local_de8,(PrecomputedScalarReferenceFiniteElement<double> *)local_cc8);
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
  ~PrecomputedScalarReferenceFiniteElement
            ((PrecomputedScalarReferenceFiniteElement<double> *)local_cc8);
  free(local_ef8);
  free((void *)local_f18._8_8_);
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  pDVar27 = local_d38;
  codim = (dim_t)local_d38;
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_modelproblem_circle_main_cc:53:12)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>_>_>
            (codim,local_d38,(DofHandler *)local_ac8,
             (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_modelproblem_circle_main_cc:53:12)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>_>
              *)local_e68,in_R8);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:139:14)>_>_>
            (codim,pDVar27,(DofHandler *)local_870,
             (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:140:15)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:139:14)>_>
              *)local_e38,in_R8);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_modelproblem_circle_main_cc:65:12)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:131:26)>_>
            (codim,pDVar27,(DofHandler *)local_e08,
             (MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_modelproblem_circle_main_cc:65:12)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_fisher_kpp_strangsplitting_h:131:26)>
              *)local_e68,in_R8);
  lf::assemble::COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)local_f18,(COOMatrix<double> *)local_e68);
  uVar33 = (ulong)local_fac;
  local_ed0._0_8_ = local_ed0._0_8_ & 0xffffffffffffff00;
  local_ed0._8_8_ = (ScalarReferenceFiniteElement<double> *)0x0;
  local_ed0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ed0._24_8_ = (double *)0x0;
  pSStack_eb0 = (RhsNested)0x0;
  local_ea8.m_values = (Scalar *)0x0;
  local_ea8.m_indices = (StorageIndex *)0x0;
  local_ea8.m_size = 0;
  local_ea8.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)local_ed0,uVar33,uVar33);
  lf::assemble::COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)local_cc8,(COOMatrix<double> *)local_e38);
  IVar14 = local_ea8.m_allocatedSize;
  IVar13 = local_ea8.m_size;
  pSVar12 = local_ea8.m_indices;
  pSVar11 = local_ea8.m_values;
  uVar5 = local_ed0._16_8_;
  uVar10 = local_ed0._8_8_;
  if (local_cc8[0] == true) {
    pdVar30 = (double *)aStack_cb8._8_8_;
    pSVar7 = pSStack_ca8;
    local_ed0._8_8_ = local_cc8._8_8_;
    local_ed0._16_8_ = aStack_cb8._M_allocated_capacity;
    local_cc8._8_8_ = uVar10;
    aStack_cb8._M_allocated_capacity = uVar5;
    aStack_cb8._8_8_ = local_ed0._24_8_;
    pSStack_ca8 = pSStack_eb0;
    local_ea8.m_values = local_ca0.m_values;
    local_ea8.m_indices = local_ca0.m_indices;
    local_ca0.m_values = pSVar11;
    local_ca0.m_indices = pSVar12;
    local_ea8.m_size = local_ca0.m_size;
    local_ea8.m_allocatedSize = local_ca0.m_allocatedSize;
    local_ca0.m_size = IVar13;
    local_ca0.m_allocatedSize = IVar14;
    local_ed0._24_8_ = pdVar30;
    pSStack_eb0 = pSVar7;
  }
  else {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)local_ed0,(SparseMatrix<double,_0,_int> *)local_cc8);
    if (pSStack_ca8 == (RhsNested)0x0) {
      sVar36 = local_ed0._8_8_ * 4 + 4;
      if (sVar36 != 0) {
        memcpy((void *)local_ed0._24_8_,(void *)aStack_cb8._8_8_,sVar36);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=(&local_ea8,&local_ca0);
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                ((SparseMatrix<double,_0,_int> *)local_ed0,(SparseMatrix<double,_0,_int> *)local_cc8
                );
    }
  }
  free((void *)aStack_cb8._8_8_);
  free(pSStack_ca8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_ca0);
  local_d78.m_storage.m_data = (double *)0x0;
  local_d78.m_storage.m_rows = 0;
  local_d78.m_storage.m_cols = 0;
  lVar34 = CONCAT26(local_f18._22_2_,
                    CONCAT15(local_f18[0x15],CONCAT14(local_f18[0x14],local_f18._16_4_)));
  if (((double *)local_f18._8_8_ != (double *)0x0 && lVar34 != 0) &&
     (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar4 / SEXT816((long)local_f18._8_8_),0) < lVar34)) {
    puVar32 = (undefined8 *)
              __cxa_allocate_exception(8,lVar34,SUB168(auVar4 % SEXT816((long)local_f18._8_8_),0));
    *puVar32 = &std::out_of_range::vtable;
    __cxa_throw(puVar32,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_d78,lVar34,local_f18._8_8_);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::SparseMatrix<double,_0,_int>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Sparse2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_d78,(SparseMatrix<double,_0,_int> *)local_f18,
        (assign_op<double,_double> *)local_cc8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)local_cc8,(Lhs *)&local_d78,(Rhs *)&local_e88,
                  (scalar_difference_op<double,_double> *)local_d30);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b18,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_cc8);
  local_d30._0_8_ = local_d30._0_8_ & 0xffffffffffffff00;
  local_d30._8_8_ = (ScalarReferenceFiniteElement<double> *)0x0;
  local_d30._16_8_ = (double *)0x0;
  local_d30._24_8_ = (double *)0x0;
  pSStack_d10 = (StorageIndex *)0x0;
  local_d08.m_values = (double *)0x0;
  local_d08.m_indices = (StorageIndex *)0x0;
  local_d08.m_size = 0;
  local_d08.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)local_d30,uVar33,uVar33);
  local_cc8._0_8_ = local_cc8._0_8_ & 0xffffffffffffff00;
  aStack_cb8._M_allocated_capacity = 0;
  aStack_cb8._8_8_ = (double *)0x3d719799812dea11;
  local_cc8._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b18;
  Eigen::SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)local_d30,
             (SparseMatrixBase<Eigen::SparseView<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_cc8);
  dst = &local_618.A_;
  std::pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>_>::
  pair<Eigen::SparseMatrix<double,_0,_int>_&,_Eigen::SparseMatrix<double,_0,_int>_&,_true>
            ((pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>_> *)
             local_cc8,(SparseMatrix<double,_0,_int> *)local_d30,
             (SparseMatrix<double,_0,_int> *)local_ed0);
  std::pair<Eigen::SparseMatrix<double,_0,_int>,_Eigen::SparseMatrix<double,_0,_int>_>::operator=
            (&local_fa8,(type)local_cc8);
  free(local_c68);
  free(local_c60);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(local_c58);
  free((void *)aStack_cb8._8_8_);
  free(pSStack_ca8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_ca0);
  free((void *)local_d30._24_8_);
  free(pSStack_d10);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_d08);
  free(local_b18[0]);
  free(local_d78.m_storage.m_data);
  free((void *)local_ed0._24_8_);
  free(pSStack_eb0);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_ea8);
  free((void *)CONCAT26(local_f18._30_2_,CONCAT15(local_f18[0x1d],local_f18._24_5_)));
  free(local_ef8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_ef0);
  local_e08._0_8_ = &PTR__MassEdgeMatrixProvider_0048d5b0;
  lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
  ~PrecomputedScalarReferenceFiniteElement(&local_de8);
  local_870._0_8_ = &PTR_isActive_0048d578;
  lVar34 = 0x1e8;
  do {
    lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
    ~PrecomputedScalarReferenceFiniteElement
              ((PrecomputedScalarReferenceFiniteElement<double> *)(local_870 + lVar34));
    lVar34 = lVar34 + -0x70;
  } while (lVar34 != -0x48);
  local_ac8._0_8_ = &PTR_isActive_0048d540;
  lVar34 = 0x1e8;
  dst_00 = &local_618.M_;
  this_00 = &local_618.solver1;
  do {
    lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
    ~PrecomputedScalarReferenceFiniteElement
              ((PrecomputedScalarReferenceFiniteElement<double> *)(local_ac8 + lVar34));
    lVar34 = lVar34 + -0x70;
  } while (lVar34 != -0x48);
  if ((pointer)local_e38._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_e38._8_8_,(long)local_e20 - local_e38._8_8_);
  }
  if ((pointer)local_e68._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_e68._8_8_,(long)local_e50.bd_flags - local_e68._8_8_);
  }
  local_b00.super_MeshDataSet<bool>._vptr_MeshDataSet = (_func_int **)&PTR_operator___0048d870;
  if ((int *)local_b00.data_.m_holder.m_capacity != (int *)0x0) {
    operator_delete(local_b00.data_.m_holder.m_start,local_b00.data_.m_holder.m_capacity);
  }
  if (local_b00.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b00.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd8._M_pi);
  }
  if (local_e18.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e18.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  IVar19 = local_618.A_.m_data.m_allocatedSize;
  IVar18 = local_618.A_.m_data.m_size;
  pSVar12 = local_618.A_.m_data.m_indices;
  pSVar11 = local_618.A_.m_data.m_values;
  pSVar17 = local_618.A_.m_innerNonZeros;
  pSVar16 = local_618.A_.m_outerIndex;
  IVar14 = local_618.A_.m_innerSize;
  IVar13 = local_618.A_.m_outerSize;
  if (local_fa8.first.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    local_618.A_.m_outerSize = local_fa8.first.m_outerSize;
    local_618.A_.m_innerSize = local_fa8.first.m_innerSize;
    local_fa8.first.m_outerSize = IVar13;
    local_fa8.first.m_innerSize = IVar14;
    local_618.A_.m_outerIndex = local_fa8.first.m_outerIndex;
    local_618.A_.m_innerNonZeros = local_fa8.first.m_innerNonZeros;
    local_fa8.first.m_outerIndex = pSVar16;
    local_fa8.first.m_innerNonZeros = pSVar17;
    local_618.A_.m_data.m_values = local_fa8.first.m_data.m_values;
    local_618.A_.m_data.m_indices = local_fa8.first.m_data.m_indices;
    local_fa8.first.m_data.m_values = pSVar11;
    local_fa8.first.m_data.m_indices = pSVar12;
    local_618.A_.m_data.m_size = local_fa8.first.m_data.m_size;
    local_618.A_.m_data.m_allocatedSize = local_fa8.first.m_data.m_allocatedSize;
    local_fa8.first.m_data.m_size = IVar18;
    local_fa8.first.m_data.m_allocatedSize = IVar19;
  }
  else {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst,&local_fa8.first);
    if (local_fa8.first.m_innerNonZeros == (StorageIndex *)0x0) {
      sVar36 = local_618.A_.m_outerSize * 4 + 4;
      if (sVar36 != 0) {
        memcpy(local_618.A_.m_outerIndex,local_fa8.first.m_outerIndex,sVar36);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=
                (&local_618.A_.m_data,(CompressedStorage<double,_int> *)((long)&local_fa8 + 0x28));
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst,&local_fa8.first);
    }
  }
  IVar19 = local_618.M_.m_data.m_allocatedSize;
  IVar18 = local_618.M_.m_data.m_size;
  pSVar12 = local_618.M_.m_data.m_indices;
  pSVar11 = local_618.M_.m_data.m_values;
  pSVar17 = local_618.M_.m_innerNonZeros;
  pSVar16 = local_618.M_.m_outerIndex;
  IVar14 = local_618.M_.m_innerSize;
  IVar13 = local_618.M_.m_outerSize;
  if (local_fa8.second.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    local_618.M_.m_outerSize = local_fa8.second.m_outerSize;
    local_618.M_.m_innerSize = local_fa8.second.m_innerSize;
    local_fa8.second.m_outerSize = IVar13;
    local_fa8.second.m_innerSize = IVar14;
    local_618.M_.m_outerIndex = local_fa8.second.m_outerIndex;
    local_618.M_.m_innerNonZeros = local_fa8.second.m_innerNonZeros;
    local_fa8.second.m_outerIndex = pSVar16;
    local_fa8.second.m_innerNonZeros = pSVar17;
    local_618.M_.m_data.m_values = local_fa8.second.m_data.m_values;
    local_618.M_.m_data.m_indices = local_fa8.second.m_data.m_indices;
    local_fa8.second.m_data.m_values = pSVar11;
    local_fa8.second.m_data.m_indices = pSVar12;
    local_618.M_.m_data.m_size = local_fa8.second.m_data.m_size;
    local_618.M_.m_data.m_allocatedSize = local_fa8.second.m_data.m_allocatedSize;
    local_fa8.second.m_data.m_size = IVar18;
    local_fa8.second.m_data.m_allocatedSize = IVar19;
  }
  else {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst_00,
               (SparseMatrix<double,_0,_int> *)((long)&local_fa8 + 0x48U));
    if (local_fa8.second.m_innerNonZeros == (StorageIndex *)0x0) {
      sVar36 = local_618.M_.m_outerSize * 4 + 4;
      if (sVar36 != 0) {
        memcpy(local_618.M_.m_outerIndex,local_fa8.second.m_outerIndex,sVar36);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=
                (&local_618.M_.m_data,&local_fa8.second.m_data);
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst_00,(SparseMatrix<double,_0,_int> *)((long)&local_fa8 + 0x48U));
    }
  }
  local_618.kappa_ = 0.2928932188134524;
  local_618.tau_ = local_618.T_ / (double)local_618.m_;
  local_f18._0_8_ = local_618.tau_ * 0.5 * 0.2928932188134524;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_e08,local_618.A_.m_innerSize,local_618.A_.m_outerSize,
                   (scalar_constant_op<double> *)local_f18);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                   *)local_cc8,(Lhs *)local_e08,dst,(scalar_product_op<double,_double> *)local_ed0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                   *)local_870,dst_00,(Rhs *)local_cc8,(scalar_sum_op<double,_double> *)local_e08);
  local_ac8._0_8_ = local_ac8._0_8_ & 0xffffffffffffff00;
  local_ac8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_ab8._0_8_ = 0;
  auStack_ab8._8_8_ = (void *)0x0;
  auStack_aa8 = (undefined1  [8])0x0;
  local_aa0._0_8_ = (Scalar *)0x0;
  local_aa0._8_8_ = (StorageIndex *)0x0;
  local_a90[0]._0_8_ = (pointer)0x0;
  local_a90[0].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  Eigen::internal::
  assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::SparseMatrix<double,0,int>const>const>>
            ((SparseMatrix<double,_0,_int> *)local_ac8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
              *)local_870);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            (this_00,(MatrixType *)local_ac8);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            (this_00,(MatrixType *)local_ac8);
  free((void *)auStack_ab8._8_8_);
  free((void *)auStack_aa8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
            ((CompressedStorage<double,_int> *)local_aa0);
  CVar22 = Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::info
                     (this_00);
  if (CVar22 == Success) {
    local_f18._0_8_ = local_618.tau_ * local_618.kappa_;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)local_e08,local_618.A_.m_innerSize,local_618.A_.m_outerSize,
                     (scalar_constant_op<double> *)local_f18);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                     *)local_cc8,(Lhs *)local_e08,dst,(scalar_product_op<double,_double> *)local_ed0
                   );
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                     *)local_870,dst_00,(Rhs *)local_cc8,(scalar_sum_op<double,_double> *)local_e08)
    ;
    local_ac8._0_8_ = local_ac8._0_8_ & 0xffffffffffffff00;
    local_ac8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_ab8._0_8_ = 0;
    auStack_ab8._8_8_ = (void *)0x0;
    auStack_aa8 = (undefined1  [8])0x0;
    local_aa0._0_8_ = (Scalar *)0x0;
    local_aa0._8_8_ = (StorageIndex *)0x0;
    local_a90[0]._0_8_ = (pointer)0x0;
    local_a90[0].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    Eigen::internal::
    assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::SparseMatrix<double,0,int>const>const>>
              ((SparseMatrix<double,_0,_int> *)local_ac8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                *)local_870);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
    analyzePattern(this,(MatrixType *)local_ac8);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
              (this,(MatrixType *)local_ac8);
    free((void *)auStack_ab8._8_8_);
    free((void *)auStack_aa8);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
              ((CompressedStorage<double,_int> *)local_aa0);
    CVar22 = Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::info
                       (this);
    if (CVar22 == Success) {
      free(local_fa8.second.m_outerIndex);
      free(local_fa8.second.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_fa8.second.m_data);
      free(local_fa8.first.m_outerIndex);
      free(local_fa8.first.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                ((CompressedStorage<double,_int> *)((long)&local_fa8 + 0x28));
      local_e08._0_8_ = (ScalarReferenceFiniteElement<double> *)0x0;
      local_e08._8_8_ = (double *)0x0;
      local_e08._16_8_ = (double *)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e08,local_1018,
                 0x14);
      FisherKPP::StrangSplit::Evolution
                ((StrangSplit *)local_870,(VectorXd *)&local_618,(VectorXd *)&local_1028);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,0);
      uVar10 = local_870._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_870,(assign_op<double,_double> *)local_cc8
                );
      p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_;
      if (((local_ac8._0_8_ & 7) == 0) &&
         (p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (ulong)((uint)((ulong)local_ac8._0_8_ >> 3) & 1),
         (long)local_ac8._8_8_ <= (long)p_Var38)) {
        p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_;
      }
      lVar34 = local_ac8._8_8_ - (long)p_Var38;
      if (0 < (long)p_Var38) {
        p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          *(undefined8 *)(local_ac8._0_8_ + (long)p_Var41 * 8) =
               *(undefined8 *)(uVar10 + (long)p_Var41 * 8);
          p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var41->_vptr__Sp_counted_base + 1);
        } while (p_Var38 != p_Var41);
      }
      p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var38->_vptr__Sp_counted_base +
                (lVar34 - (lVar34 >> 0x3f) & 0xfffffffffffffffeU));
      if (1 < lVar34) {
        do {
          uVar5 = *(undefined8 *)((pointer)(uVar10 + (long)p_Var38 * 8) + 8);
          *(undefined8 *)(local_ac8._0_8_ + (long)p_Var38 * 8) =
               *(undefined8 *)(uVar10 + (long)p_Var38 * 8);
          *(undefined8 *)((pointer)(local_ac8._0_8_ + (long)p_Var38 * 8) + 8) = uVar5;
          p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var38->_vptr__Sp_counted_base + 2);
        } while ((long)p_Var38 < (long)p_Var41);
      }
      if ((long)p_Var41 < (long)local_ac8._8_8_) {
        do {
          *(undefined8 *)(local_ac8._0_8_ + (long)p_Var41 * 8) =
               *(undefined8 *)(uVar10 + (long)p_Var41 * 8);
          p_Var41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var41->_vptr__Sp_counted_base + 1);
        } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_ != p_Var41);
      }
      free((void *)local_870._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sol1",4);
      local_ac8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_ac8,1);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,0);
      local_fa8.first._0_8_ = (double *)0x0;
      local_fa8.first.m_outerSize = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_fa8,
                 local_ac8._8_8_,1);
      uVar10 = local_ac8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_fa8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (assign_op<double,_double> *)local_870);
      uVar33 = local_fa8.first.m_outerSize - (local_fa8.first.m_outerSize >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_fa8.first.m_outerSize) {
        lVar34 = 0;
        do {
          pdVar30 = (double *)(uVar10 + lVar34 * 8);
          dVar43 = pdVar30[1];
          *(double *)(local_fa8.first._0_8_ + lVar34 * 8) = *pdVar30;
          ((double *)(local_fa8.first._0_8_ + lVar34 * 8))[1] = dVar43;
          lVar34 = lVar34 + 2;
        } while (lVar34 < (long)uVar33);
      }
      if ((long)uVar33 < local_fa8.first.m_outerSize) {
        do {
          *(double *)(local_fa8.first._0_8_ + uVar33 * 8) = *(double *)(uVar10 + uVar33 * 8);
          uVar33 = uVar33 + 1;
        } while (local_fa8.first.m_outerSize != uVar33);
      }
      FisherKPP::StrangSplit::Evolution
                ((StrangSplit *)local_cc8,(VectorXd *)&local_618,(VectorXd *)&local_1028);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,1);
      uVar10 = local_cc8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_cc8,(assign_op<double,_double> *)local_f18
                );
      peVar37 = (element_type *)local_870._8_8_;
      if (((local_870._0_8_ & 7) == 0) &&
         (peVar37 = (element_type *)(ulong)((uint)((ulong)local_870._0_8_ >> 3) & 1),
         (long)local_870._8_8_ <= (long)peVar37)) {
        peVar37 = (element_type *)local_870._8_8_;
      }
      lVar34 = local_870._8_8_ - (long)peVar37;
      if (0 < (long)peVar37) {
        peVar42 = (element_type *)0x0;
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while (peVar37 != peVar42);
      }
      peVar42 = (element_type *)
                ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                 &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace +
                (lVar34 - (lVar34 >> 0x3f) & 0xfffffffffffffffe));
      if (1 < lVar34) {
        do {
          uVar5 = *(undefined8 *)((pointer)(uVar10 + (long)peVar37 * 8) + 8);
          *(undefined8 *)(local_870._0_8_ + (long)peVar37 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar37 * 8);
          *(undefined8 *)((pointer)(local_870._0_8_ + (long)peVar37 * 8) + 8) = uVar5;
          peVar37 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 2);
        } while ((long)peVar37 < (long)peVar42);
      }
      if ((long)peVar42 < (long)local_870._8_8_) {
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_870._8_8_ != peVar42);
      }
      free((void *)local_cc8._0_8_);
      free((void *)local_fa8.first._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sol2",4);
      local_ac8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_ac8,1);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,1);
      local_fa8.first._0_8_ = (double *)0x0;
      local_fa8.first.m_outerSize = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_fa8,
                 local_ac8._8_8_,1);
      uVar10 = local_ac8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_fa8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (assign_op<double,_double> *)local_870);
      uVar33 = local_fa8.first.m_outerSize - (local_fa8.first.m_outerSize >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_fa8.first.m_outerSize) {
        lVar34 = 0;
        do {
          pdVar30 = (double *)(uVar10 + lVar34 * 8);
          dVar43 = pdVar30[1];
          *(double *)(local_fa8.first._0_8_ + lVar34 * 8) = *pdVar30;
          ((double *)(local_fa8.first._0_8_ + lVar34 * 8))[1] = dVar43;
          lVar34 = lVar34 + 2;
        } while (lVar34 < (long)uVar33);
      }
      if ((long)uVar33 < local_fa8.first.m_outerSize) {
        do {
          *(double *)(local_fa8.first._0_8_ + uVar33 * 8) = *(double *)(uVar10 + uVar33 * 8);
          uVar33 = uVar33 + 1;
        } while (local_fa8.first.m_outerSize != uVar33);
      }
      FisherKPP::StrangSplit::Evolution
                ((StrangSplit *)local_cc8,(VectorXd *)&local_618,(VectorXd *)&local_1028);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,2);
      uVar10 = local_cc8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_cc8,(assign_op<double,_double> *)local_f18
                );
      peVar37 = (element_type *)local_870._8_8_;
      if (((local_870._0_8_ & 7) == 0) &&
         (peVar37 = (element_type *)(ulong)((uint)((ulong)local_870._0_8_ >> 3) & 1),
         (long)local_870._8_8_ <= (long)peVar37)) {
        peVar37 = (element_type *)local_870._8_8_;
      }
      lVar34 = local_870._8_8_ - (long)peVar37;
      if (0 < (long)peVar37) {
        peVar42 = (element_type *)0x0;
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while (peVar37 != peVar42);
      }
      peVar42 = (element_type *)
                ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                 &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace +
                (lVar34 - (lVar34 >> 0x3f) & 0xfffffffffffffffe));
      if (1 < lVar34) {
        do {
          uVar5 = *(undefined8 *)((pointer)(uVar10 + (long)peVar37 * 8) + 8);
          *(undefined8 *)(local_870._0_8_ + (long)peVar37 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar37 * 8);
          *(undefined8 *)((pointer)(local_870._0_8_ + (long)peVar37 * 8) + 8) = uVar5;
          peVar37 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 2);
        } while ((long)peVar37 < (long)peVar42);
      }
      if ((long)peVar42 < (long)local_870._8_8_) {
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_870._8_8_ != peVar42);
      }
      free((void *)local_cc8._0_8_);
      free((void *)local_fa8.first._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sol3",4);
      local_ac8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_ac8,1);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,2);
      local_fa8.first._0_8_ = (double *)0x0;
      local_fa8.first.m_outerSize = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_fa8,
                 local_ac8._8_8_,1);
      uVar10 = local_ac8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_fa8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (assign_op<double,_double> *)local_870);
      uVar33 = local_fa8.first.m_outerSize - (local_fa8.first.m_outerSize >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_fa8.first.m_outerSize) {
        lVar34 = 0;
        do {
          pdVar30 = (double *)(uVar10 + lVar34 * 8);
          dVar43 = pdVar30[1];
          *(double *)(local_fa8.first._0_8_ + lVar34 * 8) = *pdVar30;
          ((double *)(local_fa8.first._0_8_ + lVar34 * 8))[1] = dVar43;
          lVar34 = lVar34 + 2;
        } while (lVar34 < (long)uVar33);
      }
      if ((long)uVar33 < local_fa8.first.m_outerSize) {
        do {
          *(double *)(local_fa8.first._0_8_ + uVar33 * 8) = *(double *)(uVar10 + uVar33 * 8);
          uVar33 = uVar33 + 1;
        } while (local_fa8.first.m_outerSize != uVar33);
      }
      FisherKPP::StrangSplit::Evolution
                ((StrangSplit *)local_cc8,(VectorXd *)&local_618,(VectorXd *)&local_1028);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,3);
      uVar10 = local_cc8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_cc8,(assign_op<double,_double> *)local_f18
                );
      peVar37 = (element_type *)local_870._8_8_;
      if (((local_870._0_8_ & 7) == 0) &&
         (peVar37 = (element_type *)(ulong)((uint)((ulong)local_870._0_8_ >> 3) & 1),
         (long)local_870._8_8_ <= (long)peVar37)) {
        peVar37 = (element_type *)local_870._8_8_;
      }
      lVar34 = local_870._8_8_ - (long)peVar37;
      if (0 < (long)peVar37) {
        peVar42 = (element_type *)0x0;
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while (peVar37 != peVar42);
      }
      peVar42 = (element_type *)
                ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                 &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace +
                (lVar34 - (lVar34 >> 0x3f) & 0xfffffffffffffffe));
      if (1 < lVar34) {
        do {
          uVar5 = *(undefined8 *)((pointer)(uVar10 + (long)peVar37 * 8) + 8);
          *(undefined8 *)(local_870._0_8_ + (long)peVar37 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar37 * 8);
          *(undefined8 *)((pointer)(local_870._0_8_ + (long)peVar37 * 8) + 8) = uVar5;
          peVar37 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 2);
        } while ((long)peVar37 < (long)peVar42);
      }
      if ((long)peVar42 < (long)local_870._8_8_) {
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_870._8_8_ != peVar42);
      }
      free((void *)local_cc8._0_8_);
      free((void *)local_fa8.first._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sol4",4);
      local_ac8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_ac8,1);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,3);
      local_fa8.first._0_8_ = (CodimMeshDataSet<double> *)0x0;
      local_fa8.first.m_outerSize = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_fa8,
                 local_ac8._8_8_,1);
      uVar10 = local_ac8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_fa8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_ac8,
                 (assign_op<double,_double> *)local_870);
      p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (local_fa8.first.m_outerSize - (local_fa8.first.m_outerSize >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_fa8.first.m_outerSize) {
        lVar34 = 0;
        do {
          pcVar1 = (pointer)(uVar10 + lVar34 * 8);
          peVar6 = *(element_type **)(pcVar1 + 8);
          ((MeshDataSet<double> *)local_fa8.first._0_8_)[lVar34]._vptr_MeshDataSet =
               *(_func_int ***)pcVar1;
          (((shared_ptr<const_lf::mesh::Mesh> *)
           ((MeshDataSet<double> *)local_fa8.first._0_8_ + lVar34 + 1))->
          super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar6;
          lVar34 = lVar34 + 2;
        } while (lVar34 < (long)p_Var38);
      }
      if ((long)p_Var38 < local_fa8.first.m_outerSize) {
        do {
          ((MeshDataSet<double> *)local_fa8.first._0_8_)[(long)p_Var38]._vptr_MeshDataSet =
               *(_func_int ***)(uVar10 + (long)p_Var38 * 8);
          p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var38->_vptr__Sp_counted_base + 1);
        } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fa8.first.m_outerSize !=
                 p_Var38);
      }
      FisherKPP::StrangSplit::Evolution
                ((StrangSplit *)local_cc8,(VectorXd *)&local_618,(VectorXd *)&local_1028);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,4);
      uVar10 = local_cc8._0_8_;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_870,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_cc8,(assign_op<double,_double> *)local_f18
                );
      peVar37 = (element_type *)local_870._8_8_;
      if (((local_870._0_8_ & 7) == 0) &&
         (peVar37 = (element_type *)(ulong)((uint)((ulong)local_870._0_8_ >> 3) & 1),
         (long)local_870._8_8_ <= (long)peVar37)) {
        peVar37 = (element_type *)local_870._8_8_;
      }
      lVar34 = local_870._8_8_ - (long)peVar37;
      if (0 < (long)peVar37) {
        peVar42 = (element_type *)0x0;
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while (peVar37 != peVar42);
      }
      peVar42 = (element_type *)
                ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                 &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace +
                (lVar34 - (lVar34 >> 0x3f) & 0xfffffffffffffffe));
      if (1 < lVar34) {
        do {
          uVar5 = *(undefined8 *)((pointer)(uVar10 + (long)peVar37 * 8) + 8);
          *(undefined8 *)(local_870._0_8_ + (long)peVar37 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar37 * 8);
          *(undefined8 *)((pointer)(local_870._0_8_ + (long)peVar37 * 8) + 8) = uVar5;
          peVar37 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar37->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 2);
        } while ((long)peVar37 < (long)peVar42);
      }
      if ((long)peVar42 < (long)local_870._8_8_) {
        do {
          *(undefined8 *)(local_870._0_8_ + (long)peVar42 * 8) =
               *(undefined8 *)(uVar10 + (long)peVar42 * 8);
          peVar42 = (element_type *)
                    ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &(peVar42->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_870._8_8_ != peVar42);
      }
      free((void *)local_cc8._0_8_);
      free((void *)local_fa8.first._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sol5",4);
      local_ac8[0] = 10;
      lVar34 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_ac8,1);
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)local_870);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_860,"sol",3);
        poVar25 = (ostream *)std::ostream::operator<<(local_860,(int)lVar34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25,".vtk",4);
        local_e48.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_e48.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::__cxx11::stringbuf::str();
        lf::io::VtkWriter::VtkWriter((VtkWriter *)local_ac8,&local_e48,&local_ce8,0,'\x01');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
          operator_delete(local_ce8._M_dataplus._M_p,local_ce8.field_2._M_allocated_capacity + 1);
        }
        if (local_e48.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e48.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        lf::mesh::utils::make_CodimMeshDataSet<double>((utils *)&local_fa8,&local_fc0,2);
        if (local_100c != 0) {
          uVar33 = 0;
          do {
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_cc8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)local_e08,lVar34 + -1);
            pSVar29 = Eigen::
                      DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                      ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                    *)local_cc8,uVar33);
            uVar10 = local_fa8.first._0_8_;
            local_1008 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pSVar29;
            e = (Entity *)(**(code **)(*local_fc8 + 0x38))(local_fc8,uVar33);
            pdVar30 = lf::mesh::utils::CodimMeshDataSet<double>::operator()
                                ((CodimMeshDataSet<double> *)uVar10,e);
            *pdVar30 = (double)local_1008;
            uVar33 = uVar33 + 1;
          } while (local_1018 != uVar33);
        }
        local_cc8._0_8_ = local_cc8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"sol","");
        lf::io::VtkWriter::WritePointData
                  ((VtkWriter *)local_ac8,(string *)local_cc8,
                   (MeshDataSet<double> *)local_fa8.first._0_8_,0.0);
        if ((undefined1 *)local_cc8._0_8_ != local_cc8 + 0x10) {
          operator_delete((void *)local_cc8._0_8_,(ulong)(aStack_cb8._M_allocated_capacity + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fa8.first.m_outerSize !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fa8.first.m_outerSize);
        }
        lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_ac8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_870);
        std::ios_base::~ios_base((ios_base *)(local_848 + 0x58));
        lVar34 = lVar34 + 1;
      } while (lVar34 != 6);
      free((void *)local_e08._0_8_);
      FisherKPP::StrangSplit::~StrangSplit(&local_618);
      free(local_1028.m_storage.m_data);
      free(local_e88.m_storage.m_data);
      free(local_ff8.m_storage.m_data);
      if (local_fd0 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_fd0);
      }
      if (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_fc0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_b8.nr_2_name_._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_b8.name_2_nr_._M_t);
      if (local_b8.physical_nrs_.
          super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.physical_nrs_.
                   super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
          local_b8.mesh_factory_._M_t.
          super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
          _M_t.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0)
      {
        (*(*(_func_int ***)
            local_b8.mesh_factory_._M_t.
            super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
            ._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)[7])();
      }
      local_b8.mesh_factory_._M_t.
      super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t
      .super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
           (__uniq_ptr_data<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>,_true,_true>
            )(__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)
             0x0;
      if (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.mesh_.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
        operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_b40);
      return 0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_ac8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_ab8,"LU decomposition failed",0x17);
    local_870._0_8_ = local_860;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_870,"solver2.info() == Eigen::Success","");
    local_cc8._0_8_ = local_cc8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_cc8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/fisher_kpp/strangsplitting.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_870,(string *)local_cc8,0xc5,(string *)local_e08);
    if ((ScalarReferenceFiniteElement<double> *)local_e08._0_8_ !=
        (ScalarReferenceFiniteElement<double> *)(local_e08 + 0x10)) {
      operator_delete((void *)local_e08._0_8_,local_e08._16_8_ + 1);
    }
    if ((undefined1 *)local_cc8._0_8_ != local_cc8 + 0x10) {
      operator_delete((void *)local_cc8._0_8_,(ulong)(aStack_cb8._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_870._0_8_ != local_860) {
      operator_delete((void *)local_870._0_8_,local_860._0_8_ + 1);
    }
    prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar31,"this code should not be reached");
    __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_ac8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_ab8,"LU decomposition failed",0x17);
  local_870._0_8_ = local_860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_870,"solver1.info() == Eigen::Success","");
  local_cc8._0_8_ = local_cc8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/fisher_kpp/strangsplitting.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_870,(string *)local_cc8,0xc3,(string *)local_e08);
  if ((ScalarReferenceFiniteElement<double> *)local_e08._0_8_ !=
      (ScalarReferenceFiniteElement<double> *)(local_e08 + 0x10)) {
    operator_delete((void *)local_e08._0_8_,local_e08._16_8_ + 1);
  }
  if ((undefined1 *)local_cc8._0_8_ != local_cc8 + 0x10) {
    operator_delete((void *)local_cc8._0_8_,(ulong)(aStack_cb8._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_870._0_8_ != local_860) {
    operator_delete((void *)local_870._0_8_,local_860._0_8_ + 1);
  }
  prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar31,"this code should not be reached");
  __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int /*argc*/, char ** /*argv*/) {
  /* Obtain mesh */
  auto mesh_factory = std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  const std::filesystem::path here = __FILE__;

  /* In case of one circle: Mesh 1. */
  auto mesh_file = (here.parent_path() / "/meshes/circle.msh").string();
  const lf::io::GmshReader reader(std::move(mesh_factory), mesh_file);
  const std::shared_ptr<const lf::mesh::Mesh> mesh_p = reader.mesh();
  /* Finite Element Space */
  std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> fe_space =
      std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(mesh_p);
  /* Dofhandler */
  const lf::assemble::DofHandler &dofh{fe_space->LocGlobMap()};
  const lf::uscalfe::size_type N_dofs(dofh.NumDofs());

  std::cout << "N_dofs :" << N_dofs << '\n';

  /* Initial Population density */
  Eigen::VectorXd u0(N_dofs);
  u0.setZero();

  /* In case of the circle: Mesh 1. For one source only: */
  u0(0) = 0.001;
  /* For two sources on the circle: */
  /* u0(0) = 0.0005;
   * u0(53) = 0.0005;
   */

  std::cout << "norm u0 " << u0.norm() << '\n';

  /* Diffusion Coefficient */
  auto c = [](const Eigen::Vector2d & /*x*/) -> double {
    /* In case of the circle: Mesh 1. */
    return 0.007;
  };

  /* Growth Factor */
  /* In case of the circle: Mesh 1. */
  const double lambda = 0.008;

  /* Boundary Conditions. */

  /* In case of the circle: Mesh 1. */
  auto h = [](const Eigen::Vector2d & /*x*/) -> double { return 0.0; };
  Eigen::MatrixXd L(N_dofs, N_dofs);
  L.setZero();

  /* Strang Splitting Method
   * SDIRK-2 evolution of linear parabolic term
   * Exact Evolution for nonlinear reaction term
   */

  /* Total number of timesteps */
  const unsigned int m = 100;
  const double T = 1.;  // the timestepsize tau will equal T/m = 0.01

  /* First we assemble the carrying capacity maps */

  Eigen::VectorXd cap(N_dofs);
  cap.setZero();
  cap = 0.8 * Eigen::VectorXd::Ones(N_dofs);

  /* Now we may compute the solution */
  StrangSplit StrangSplitter(fe_space, T, m, lambda, c, h, L);

  Eigen::MatrixXd sol(N_dofs, 20);

  sol.col(0) = StrangSplitter.Evolution(cap, u0);
  std::cout << "sol1" << '\n';
  sol.col(1) = StrangSplitter.Evolution(cap, sol.col(0));
  std::cout << "sol2" << '\n';
  sol.col(2) = StrangSplitter.Evolution(cap, sol.col(1));
  std::cout << "sol3" << '\n';
  sol.col(3) = StrangSplitter.Evolution(cap, sol.col(2));
  std::cout << "sol4" << '\n';
  sol.col(4) = StrangSplitter.Evolution(cap, sol.col(3));
  std::cout << "sol5" << '\n';

  /* Use VTK-Writer for Visualization of solution */

  for (int k = 1; k < 6; k++) {
    std::stringstream filename;
    filename << "sol" << k << ".vtk";

    lf::io::VtkWriter vtk_writer(mesh_p, filename.str());
    auto nodal_data = lf::mesh::utils::make_CodimMeshDataSet<double>(mesh_p, 2);
    for (int global_idx = 0; global_idx < N_dofs; global_idx++) {
      nodal_data->operator()(dofh.Entity(global_idx)) =
          sol.col(k - 1)[global_idx];
    }

    vtk_writer.WritePointData("sol", *nodal_data);
  }

  return 0;
}